

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.cpp
# Opt level: O0

void __thiscall gmlc::networking::TcpServer::~TcpServer(TcpServer *this)

{
  int in_ESI;
  TcpServer *in_RDI;
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  *in_stack_fffffffffffffff0;
  
  close(in_RDI,in_ESI);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
  ::~vector((vector<std::shared_ptr<gmlc::networking::TcpConnection>,_std::allocator<std::shared_ptr<gmlc::networking::TcpConnection>_>_>
             *)in_stack_fffffffffffffff0);
  std::
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x70b28f);
  std::function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>::
  ~function((function<bool_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_std::error_code_&)>
             *)0x70b2a0);
  std::
  function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
  ::~function((function<unsigned_long_(std::shared_ptr<gmlc::networking::TcpConnection>,_const_char_*,_unsigned_long)>
               *)0x70b2b1);
  std::
  vector<asio::ip::basic_endpoint<asio::ip::tcp>,_std::allocator<asio::ip::basic_endpoint<asio::ip::tcp>_>_>
  ::~vector(in_stack_fffffffffffffff0);
  std::
  vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
  ::~vector((vector<std::shared_ptr<gmlc::networking::TcpAcceptor>,_std::allocator<std::shared_ptr<gmlc::networking::TcpAcceptor>_>_>
             *)in_stack_fffffffffffffff0);
  SocketFactory::~SocketFactory((SocketFactory *)0x70b2db);
  std::enable_shared_from_this<gmlc::networking::TcpServer>::~enable_shared_from_this
            ((enable_shared_from_this<gmlc::networking::TcpServer> *)0x70b2e5);
  return;
}

Assistant:

TcpServer::~TcpServer()
{
    try {
        close();
    }
    catch (...) {
    }
}